

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int bc_get_u64(BCReaderState *s,uint64_t *pval)

{
  uint64_t *puVar1;
  
  puVar1 = (uint64_t *)s->ptr;
  if (7 < (long)s->buf_end - (long)puVar1) {
    *pval = *puVar1;
    s->ptr = (uint8_t *)(puVar1 + 1);
    return 0;
  }
  bc_get_u64_cold_1();
  return -1;
}

Assistant:

static int bc_get_u64(BCReaderState *s, uint64_t *pval)
{
    if (unlikely(s->buf_end - s->ptr < 8)) {
        *pval = 0; /* avoid warning */
        return bc_read_error_end(s);
    }
    *pval = get_u64(s->ptr);
    s->ptr += 8;
    return 0;
}